

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut.cpp
# Opt level: O0

void __thiscall QShortcut::setContext(QShortcut *this,ShortcutContext context)

{
  QShortcutPrivate *pQVar1;
  QCoreApplication *pQVar2;
  ShortcutContext in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QShortcutPrivate *d;
  QShortcutMap *in_stack_00000058;
  QShortcutPrivate *in_stack_00000060;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QShortcut *)0x9931f9);
  if (pQVar1->sc_context != in_ESI) {
    pQVar2 = QCoreApplication::instance();
    if (pQVar2 == (QCoreApplication *)0x0) {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
                 (int)((ulong)pQVar1 >> 0x20),in_stack_ffffffffffffffb8);
      QMessageLogger::warning
                (local_28,"QShortcut: Initialize QGuiApplication before calling \'setContext\'.");
    }
    else {
      pQVar1->sc_context = in_ESI;
      QGuiApplicationPrivate::instance();
      QShortcutPrivate::redoGrab(in_stack_00000060,in_stack_00000058);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QShortcut::setContext(Qt::ShortcutContext context)
{
    Q_D(QShortcut);
    if (d->sc_context == context)
        return;
    QAPP_CHECK("setContext");
    d->sc_context = context;
    d->redoGrab(QGuiApplicationPrivate::instance()->shortcutMap);
}